

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool copy_input_until_stop(EState *s)

{
  uint uVar1;
  uint uVar2;
  UChar ch_1;
  UInt32 zchh_1;
  UChar ch;
  UInt32 zchh;
  Bool progress_in;
  EState *s_local;
  
  ch = '\0';
  if (s->mode == 2) {
    while ((s->nblock < s->nblockMAX && (s->strm->avail_in != 0))) {
      ch = '\x01';
      uVar2 = (uint)(byte)*s->strm->next_in;
      if ((uVar2 == s->state_in_ch) || (s->state_in_len != 1)) {
        if ((uVar2 == s->state_in_ch) && (s->state_in_len != 0xff)) {
          s->state_in_len = s->state_in_len + 1;
        }
        else {
          if (s->state_in_ch < 0x100) {
            add_pair_to_block(s);
          }
          s->state_in_ch = uVar2;
          s->state_in_len = 1;
        }
      }
      else {
        uVar1 = s->state_in_ch;
        s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[s->blockCRC >> 0x18 ^ uVar1 & 0xff];
        s->inUse[s->state_in_ch] = '\x01';
        s->block[s->nblock] = (UChar)uVar1;
        s->nblock = s->nblock + 1;
        s->state_in_ch = uVar2;
      }
      s->strm->next_in = s->strm->next_in + 1;
      s->strm->avail_in = s->strm->avail_in - 1;
      s->strm->total_in_lo32 = s->strm->total_in_lo32 + 1;
      if (s->strm->total_in_lo32 == 0) {
        s->strm->total_in_hi32 = s->strm->total_in_hi32 + 1;
      }
    }
  }
  else {
    while (((s->nblock < s->nblockMAX && (s->strm->avail_in != 0)) && (s->avail_in_expect != 0))) {
      ch = '\x01';
      uVar2 = (uint)(byte)*s->strm->next_in;
      if ((uVar2 == s->state_in_ch) || (s->state_in_len != 1)) {
        if ((uVar2 == s->state_in_ch) && (s->state_in_len != 0xff)) {
          s->state_in_len = s->state_in_len + 1;
        }
        else {
          if (s->state_in_ch < 0x100) {
            add_pair_to_block(s);
          }
          s->state_in_ch = uVar2;
          s->state_in_len = 1;
        }
      }
      else {
        uVar1 = s->state_in_ch;
        s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[s->blockCRC >> 0x18 ^ uVar1 & 0xff];
        s->inUse[s->state_in_ch] = '\x01';
        s->block[s->nblock] = (UChar)uVar1;
        s->nblock = s->nblock + 1;
        s->state_in_ch = uVar2;
      }
      s->strm->next_in = s->strm->next_in + 1;
      s->strm->avail_in = s->strm->avail_in - 1;
      s->strm->total_in_lo32 = s->strm->total_in_lo32 + 1;
      if (s->strm->total_in_lo32 == 0) {
        s->strm->total_in_hi32 = s->strm->total_in_hi32 + 1;
      }
      s->avail_in_expect = s->avail_in_expect - 1;
    }
  }
  return ch;
}

Assistant:

static
Bool copy_input_until_stop ( EState* s )
{
   Bool progress_in = False;

   if (s->mode == BZ_M_RUNNING) {

      /*-- fast track the common case --*/
      while (True) {
         /*-- block full? --*/
         if (s->nblock >= s->nblockMAX) break;
         /*-- no input? --*/
         if (s->strm->avail_in == 0) break;
         progress_in = True;
         ADD_CHAR_TO_BLOCK ( s, (UInt32)(*((UChar*)(s->strm->next_in))) ); 
         s->strm->next_in++;
         s->strm->avail_in--;
         s->strm->total_in_lo32++;
         if (s->strm->total_in_lo32 == 0) s->strm->total_in_hi32++;
      }

   } else {

      /*-- general, uncommon case --*/
      while (True) {
         /*-- block full? --*/
         if (s->nblock >= s->nblockMAX) break;
         /*-- no input? --*/
         if (s->strm->avail_in == 0) break;
         /*-- flush/finish end? --*/
         if (s->avail_in_expect == 0) break;
         progress_in = True;
         ADD_CHAR_TO_BLOCK ( s, (UInt32)(*((UChar*)(s->strm->next_in))) ); 
         s->strm->next_in++;
         s->strm->avail_in--;
         s->strm->total_in_lo32++;
         if (s->strm->total_in_lo32 == 0) s->strm->total_in_hi32++;
         s->avail_in_expect--;
      }
   }
   return progress_in;
}